

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O1

void __thiscall
backend::codegen::RegAllocator::replace_write::anon_class_16_2_94732020::operator()
          (anon_class_16_2_94732020 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint r;
  ostream *poVar2;
  Tag *in_RSI;
  char *pcVar3;
  Tag *tag;
  ostream local_111;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined **local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined1 local_a8;
  Function local_a0;
  undefined **local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  local_111 = (ostream)0x0;
  AixLog::operator<<(&local_111,(Severity *)in_RSI);
  local_c8 = &local_b8;
  local_d0 = &PTR__Tag_001edee0;
  local_c0 = 0;
  local_b8 = 0;
  local_a8 = 1;
  AixLog::operator<<((ostream *)&local_d0,in_RSI);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48 = &PTR__Timestamp_001edeb0;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)in_RSI);
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"operator()","");
  pcVar3 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_110 = &local_100;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,"");
  paVar1 = &local_a0.name.field_2;
  local_a0._vptr_Function = (_func_int **)&PTR__Function_001edf10;
  if (local_f0 == &local_e0) {
    local_a0.name.field_2._8_8_ = local_e0._8_8_;
    local_a0.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.name._M_dataplus._M_p = (pointer)local_f0;
  }
  local_a0.file._M_dataplus._M_p = (pointer)&local_a0.file.field_2;
  local_a0.name._M_string_length = local_e8;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  if (local_110 == &local_100) {
    local_a0.file.field_2._8_8_ = local_100._8_8_;
  }
  else {
    local_a0.file._M_dataplus._M_p = (pointer)local_110;
  }
  local_a0.file._M_string_length = local_108;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_a0.line = 0x2f1;
  local_a0.is_null_ = false;
  local_110 = &local_100;
  local_f0 = &local_e0;
  AixLog::operator<<((ostream *)&local_a0,(Function *)pcVar3);
  r = this->r->from;
  tag = (Tag *)(ulong)r;
  arm::display_reg_name((ostream *)&std::clog,r);
  AixLog::Function::~Function(&local_a0);
  if (local_110 != &local_100) {
    tag = (Tag *)(CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1);
    operator_delete(local_110,(ulong)tag);
  }
  if (local_f0 != &local_e0) {
    tag = (Tag *)(CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
    operator_delete(local_f0,(ulong)tag);
  }
  local_d0 = &PTR__Tag_001edee0;
  if (local_c8 != &local_b8) {
    tag = (Tag *)(CONCAT71(uStack_b7,local_b8) + 1);
    operator_delete(local_c8,(ulong)tag);
  }
  local_111 = (ostream)0x0;
  AixLog::operator<<(&local_111,(Severity *)tag);
  local_d0 = &PTR__Tag_001edee0;
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8 = 0;
  local_a8 = 1;
  AixLog::operator<<((ostream *)&local_d0,tag);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48 = &PTR__Timestamp_001edeb0;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)tag);
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"operator()","");
  pcVar3 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_110 = &local_100;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,"");
  local_a0._vptr_Function = (_func_int **)&PTR__Function_001edf10;
  if (local_f0 == &local_e0) {
    local_a0.name.field_2._8_8_ = local_e0._8_8_;
    local_a0.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.name._M_dataplus._M_p = (pointer)local_f0;
  }
  local_a0.name.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
  local_a0.name.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
  local_a0.name._M_string_length = local_e8;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  if (local_110 == &local_100) {
    local_a0.file.field_2._8_8_ = local_100._8_8_;
    local_a0.file._M_dataplus._M_p = (pointer)&local_a0.file.field_2;
  }
  else {
    local_a0.file._M_dataplus._M_p = (pointer)local_110;
  }
  local_a0.file.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
  local_a0.file.field_2._M_local_buf[0] = local_100._M_local_buf[0];
  local_a0.file._M_string_length = local_108;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_a0.line = 0x2f2;
  local_a0.is_null_ = false;
  local_110 = &local_100;
  local_f0 = &local_e0;
  AixLog::operator<<((ostream *)&local_a0,(Function *)pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," at: ",5);
  poVar2 = (ostream *)std::ostream::operator<<(&std::clog,*this->i);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  AixLog::Function::~Function(&local_a0);
  if (local_110 != &local_100) {
    operator_delete(local_110,
                    CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0])
                             + 1);
  }
  local_d0 = &PTR__Tag_001edee0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  return;
}

Assistant:

void RegAllocator::replace_write(ReplaceWriteAction r, int i) {
  auto disp_reg = [&]() {
    display_reg_name(LOG(TRACE), r.from);
    LOG(TRACE) << " at: " << i << " ";
  };
  if (r.kind == ReplaceWriteKind::Phys) {
    // is physical register; mark as occupied
    active.insert({r.replace_with, Interval(i, UINT32_MAX)});
    disp_reg();
    LOG(TRACE) << "phys " << r.replace_with << std::endl;
    return;
  } else if (r.kind == ReplaceWriteKind::Graph) {
    // This register is allocated with graph-coloring
    disp_reg();
    LOG(TRACE) << "graph" << std::endl;
  } else if (r.kind == ReplaceWriteKind::Spill) {
    // this register is allocated in stack
    Reg rd = r.replace_with;
    int pos = get_or_alloc_spill_pos(r.from);

    bool del = false;
    if (inst_sink.size() > 0) {
      auto &x = inst_sink.back();
      if (auto x_ = dynamic_cast<LoadStoreInst *>(&*x)) {
        if (auto x__ = std::get_if<MemoryOperand>(&x_->mem);
            x_->op == arm::OpCode::StR && x__->r1 == rd &&
            x_->cond == cur_cond &&
            (*x__) == MemoryOperand(REG_SP, pos + stack_offset)) {
          del = true;
        }
      }
    }
    if (!del) {
      inst_sink.push_back(std::make_unique<LoadStoreInst>(
          OpCode::StR, rd, MemoryOperand(REG_SP, pos + stack_offset),
          cur_cond));
    }
    wrote_to.erase(r.from);
    disp_reg();
    LOG(TRACE) << "spill " << pos << " " << del << std::endl;
  } else {
    disp_reg();
    LOG(TRACE) << "temp" << std::endl;
    // Is temporary register
    // the register should already be written to or read from

    // throw new std::logic_error("Writing to transient register");
  }
}